

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanabi_game.cc
# Opt level: O3

void __thiscall
hanabi_learning_env::HanabiGame::HanabiGame
          (HanabiGame *this,
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *params)

{
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  pointer *ppHVar1;
  int *piVar2;
  uint uVar3;
  iterator iVar4;
  ulong uVar5;
  bool bVar6;
  int iVar7;
  AgentObservationType AVar8;
  uint uVar9;
  long lVar10;
  int iVar11;
  pointer pHVar12;
  int iVar13;
  undefined1 auVar14 [16];
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  undefined1 auVar19 [16];
  uint uVar20;
  uint uVar23;
  uint uVar24;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  uint uVar25;
  undefined1 auVar26 [16];
  anon_union_5000_2_650ea050_for_random_device_0 local_13b8;
  
  this_00 = &this->params_;
  (this->chance_outcomes_).
  super__Vector_base<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->chance_outcomes_).
  super__Vector_base<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined1 (*) [16])
   &(this->moves_).
    super__Vector_base<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
  (this->moves_).
  super__Vector_base<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->moves_).
  super__Vector_base<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->params_)._M_h._M_buckets = &(this->params_)._M_h._M_single_bucket;
  (this->params_)._M_h._M_bucket_count = 1;
  (this->params_)._M_h._M_before_begin = (_Hash_node_base *)0x0;
  (this->params_)._M_h._M_element_count = 0;
  (this->params_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  *(undefined1 (*) [16])&(this->params_)._M_h._M_rehash_policy._M_next_resize =
       (undefined1  [16])0x0;
  this->num_colors_ = -1;
  this->num_ranks_ = -1;
  this->num_players_ = -1;
  this->hand_size_ = -1;
  this->max_information_tokens_ = -1;
  this->max_life_tokens_ = -1;
  this->cards_per_color_ = -1;
  this->seed_ = -1;
  this->random_start_player_ = false;
  this->observation_type_ = kCardKnowledge;
  (this->rng_)._M_x[0] = 0x1571;
  pHVar12 = (pointer)0x1571;
  lVar10 = 0x13;
  do {
    pHVar12 = (pointer)(ulong)((((uint)((ulong)pHVar12 >> 0x1e) ^ (uint)pHVar12) * 0x6c078965 +
                               (int)lVar10) - 0x12);
    (&(this->moves_).
      super__Vector_base<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
      ._M_impl.super__Vector_impl_data._M_start)[lVar10] = pHVar12;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0x282);
  (this->rng_)._M_p = 0x270;
  if (this_00 != params) {
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)this_00,&params->_M_h);
  }
  piVar2 = &local_13b8.field_0._M_fd;
  local_13b8.field_0._M_file = piVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_13b8,"players","");
  iVar7 = ParameterValue<int>(this_00,(string *)&local_13b8.field_0,2);
  this->num_players_ = iVar7;
  if ((int *)local_13b8.field_0._M_file != piVar2) {
    operator_delete(local_13b8.field_0._M_file);
    iVar7 = this->num_players_;
  }
  if (iVar7 - 6U < 0xfffffffc) {
    __assert_fail("num_players_ >= MinPlayers() && num_players_ <= MaxPlayers()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jtwwang[P]hanabi/hanabi_lib/hanabi_game.cc"
                  ,0x21,
                  "hanabi_learning_env::HanabiGame::HanabiGame(const std::unordered_map<std::string, std::string> &)"
                 );
  }
  local_13b8.field_0._M_file = piVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_13b8,"colors","");
  iVar7 = ParameterValue<int>(this_00,(string *)&local_13b8.field_0,5);
  this->num_colors_ = iVar7;
  if ((int *)local_13b8.field_0._M_file != piVar2) {
    operator_delete(local_13b8.field_0._M_file);
    iVar7 = this->num_colors_;
  }
  if (4 < iVar7 - 1U) {
    __assert_fail("num_colors_ > 0 && num_colors_ <= kMaxNumColors",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jtwwang[P]hanabi/hanabi_lib/hanabi_game.cc"
                  ,0x23,
                  "hanabi_learning_env::HanabiGame::HanabiGame(const std::unordered_map<std::string, std::string> &)"
                 );
  }
  local_13b8.field_0._M_file = piVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_13b8,"ranks","");
  iVar7 = ParameterValue<int>(this_00,(string *)&local_13b8.field_0,5);
  this->num_ranks_ = iVar7;
  if ((int *)local_13b8.field_0._M_file != piVar2) {
    operator_delete(local_13b8.field_0._M_file);
    iVar7 = this->num_ranks_;
  }
  if (iVar7 - 1U < 5) {
    local_13b8.field_0._M_file = piVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_13b8,"hand_size","");
    iVar7 = ParameterValue<int>(this_00,(string *)&local_13b8.field_0,this->num_players_ < 4 | 4);
    this->hand_size_ = iVar7;
    if ((int *)local_13b8.field_0._M_file != piVar2) {
      operator_delete(local_13b8.field_0._M_file);
    }
    local_13b8.field_0._M_file = piVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_13b8,"max_information_tokens","");
    iVar7 = ParameterValue<int>(this_00,(string *)&local_13b8.field_0,8);
    this->max_information_tokens_ = iVar7;
    if ((int *)local_13b8.field_0._M_file != piVar2) {
      operator_delete(local_13b8.field_0._M_file);
    }
    local_13b8.field_0._M_file = piVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_13b8,"max_life_tokens","");
    iVar7 = ParameterValue<int>(this_00,(string *)&local_13b8.field_0,3);
    this->max_life_tokens_ = iVar7;
    if ((int *)local_13b8.field_0._M_file != piVar2) {
      operator_delete(local_13b8.field_0._M_file);
    }
    local_13b8.field_0._M_file = piVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_13b8,"seed","");
    iVar7 = ParameterValue<int>(this_00,(string *)&local_13b8.field_0,-1);
    this->seed_ = iVar7;
    if ((int *)local_13b8.field_0._M_file != piVar2) {
      operator_delete(local_13b8.field_0._M_file);
    }
    local_13b8.field_0._M_file = piVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_13b8,"random_start_player","");
    bVar6 = ParameterValue<bool>(this_00,(string *)&local_13b8.field_0,false);
    this->random_start_player_ = bVar6;
    if ((int *)local_13b8.field_0._M_file != piVar2) {
      operator_delete(local_13b8.field_0._M_file);
    }
    local_13b8.field_0._M_file = piVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_13b8,"observation_type","");
    AVar8 = ParameterValue<int>(this_00,(string *)&local_13b8.field_0,1);
    this->observation_type_ = AVar8;
    if ((int *)local_13b8.field_0._M_file != piVar2) {
      operator_delete(local_13b8.field_0._M_file);
    }
    uVar3 = this->seed_;
    while (uVar3 == 0xffffffff) {
      std::random_device::random_device((random_device *)&local_13b8.field_0);
      iVar7 = std::random_device::_M_getval();
      this->seed_ = iVar7;
      std::random_device::_M_fini();
      uVar3 = this->seed_;
    }
    pHVar12 = (pointer)(ulong)uVar3;
    (this->rng_)._M_x[0] = (unsigned_long)pHVar12;
    lVar10 = 0x13;
    do {
      pHVar12 = (pointer)(ulong)((((uint)((ulong)pHVar12 >> 0x1e) ^ (uint)pHVar12) * 0x6c078965 +
                                 (int)lVar10) - 0x12);
      (&(this->moves_).
        super__Vector_base<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
        ._M_impl.super__Vector_impl_data._M_start)[lVar10] = pHVar12;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0x282);
    (this->rng_)._M_p = 0x270;
    this->cards_per_color_ = 0;
    iVar7 = this->num_colors_;
    iVar11 = this->num_ranks_;
    if (iVar11 < 1) {
      iVar13 = 0;
    }
    else {
      uVar3 = iVar11 - 1;
      bVar6 = 0 < iVar7;
      uVar9 = iVar11 + 3U & 0xfffffffc;
      auVar14._1_3_ = 0;
      auVar14[0] = bVar6;
      auVar14[4] = bVar6;
      auVar14._5_3_ = 0;
      auVar14[8] = bVar6;
      auVar14._9_3_ = 0;
      auVar14[0xc] = bVar6;
      auVar14._13_3_ = 0;
      uVar15 = 0;
      uVar16 = 1;
      uVar17 = 2;
      uVar18 = 3;
      auVar22 = (undefined1  [16])0x0;
      do {
        auVar21 = auVar22;
        auVar19._0_4_ = -(uint)((int)(uVar3 ^ 0x80000000) < (int)(uVar15 ^ 0x80000000));
        auVar19._4_4_ = -(uint)((int)(uVar3 ^ 0x80000000) < (int)(uVar16 ^ 0x80000000));
        auVar19._8_4_ = -(uint)((int)(uVar3 ^ 0x80000000) < (int)(uVar17 ^ 0x80000000));
        auVar19._12_4_ = -(uint)((int)(uVar3 ^ 0x80000000) < (int)(uVar18 ^ 0x80000000));
        auVar26._0_4_ = -(uint)(uVar15 == 0);
        auVar26._4_4_ = -(uint)(uVar16 == 0);
        auVar26._8_4_ = -(uint)(uVar17 == 0);
        auVar26._12_4_ = -(uint)(uVar18 == 0);
        auVar22 = ~auVar26 & ~auVar19 & auVar14;
        uVar20 = (auVar22._0_4_ << 0x1f) >> 0x1f;
        uVar23 = (auVar22._4_4_ << 0x1f) >> 0x1f;
        uVar24 = (auVar22._8_4_ << 0x1f) >> 0x1f;
        uVar25 = (auVar22._12_4_ << 0x1f) >> 0x1f;
        auVar26 = auVar26 & auVar14;
        auVar22._0_4_ =
             ((~uVar20 & (auVar26._0_4_ << 0x1f) >> 0x1f) >> 0x1e | 2 - (uVar3 == uVar15) & uVar20)
             + auVar21._0_4_;
        auVar22._4_4_ =
             ((~uVar23 & (auVar26._4_4_ << 0x1f) >> 0x1f) >> 0x1e | 2 - (uVar3 == uVar16) & uVar23)
             + auVar21._4_4_;
        auVar22._8_4_ =
             ((~uVar24 & (auVar26._8_4_ << 0x1f) >> 0x1f) >> 0x1e | 2 - (uVar3 == uVar17) & uVar24)
             + auVar21._8_4_;
        auVar22._12_4_ =
             ((~uVar25 & (auVar26._12_4_ << 0x1f) >> 0x1f) >> 0x1e | 2 - (uVar3 == uVar18) & uVar25)
             + auVar21._12_4_;
        uVar15 = uVar15 + 4;
        uVar16 = uVar16 + 4;
        uVar17 = uVar17 + 4;
        uVar18 = uVar18 + 4;
        uVar9 = uVar9 - 4;
      } while (uVar9 != 0);
      auVar22 = ~auVar19 & auVar22 | auVar21 & auVar19;
      iVar13 = auVar22._12_4_ + auVar22._4_4_ + auVar22._8_4_ + auVar22._0_4_;
      this->cards_per_color_ = iVar13;
    }
    if (this->num_players_ * this->hand_size_ <= iVar13 * iVar7) {
      if (0 < (iVar11 + iVar7) * (this->num_players_ + -1) + this->hand_size_ * 2) {
        iVar13 = 0;
        do {
          local_13b8.field_0._M_file = (void *)ConstructMove(this,iVar13);
          iVar4._M_current =
               (this->moves_).
               super__Vector_base<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (iVar4._M_current ==
              (this->moves_).
              super__Vector_base<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
            ::_M_realloc_insert<hanabi_learning_env::HanabiMove>
                      (&this->moves_,iVar4,(HanabiMove *)&local_13b8.field_0);
          }
          else {
            *iVar4._M_current = (HanabiMove)local_13b8.field_0._M_file;
            ppHVar1 = &(this->moves_).
                       super__Vector_base<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppHVar1 = *ppHVar1 + 1;
          }
          iVar13 = iVar13 + 1;
          iVar7 = this->num_colors_;
          iVar11 = this->num_ranks_;
        } while (iVar13 < (iVar11 + iVar7) * (this->num_players_ + -1) + this->hand_size_ * 2);
      }
      if (0 < iVar11 * iVar7) {
        iVar13 = 0;
        do {
          uVar5 = (long)iVar13 / (long)iVar11;
          local_13b8._M_mt._M_x[0] =
               ((long)((ulong)(uint)((int)uVar5 >> 0x1f) << 0x20 | uVar5 & 0xffffffff) % (long)iVar7
               & 0xffU) << 0x30 | (long)iVar13 % (long)iVar11 << 0x38 | 0xffff00000005;
          iVar4._M_current =
               (this->chance_outcomes_).
               super__Vector_base<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (iVar4._M_current ==
              (this->chance_outcomes_).
              super__Vector_base<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
            ::_M_realloc_insert<hanabi_learning_env::HanabiMove>
                      (&this->chance_outcomes_,iVar4,(HanabiMove *)&local_13b8.field_0);
          }
          else {
            *iVar4._M_current = (HanabiMove)local_13b8.field_0._M_file;
            ppHVar1 = &(this->chance_outcomes_).
                       super__Vector_base<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppHVar1 = *ppHVar1 + 1;
          }
          iVar13 = iVar13 + 1;
          iVar7 = this->num_colors_;
          iVar11 = this->num_ranks_;
        } while (iVar13 < iVar11 * iVar7);
      }
      return;
    }
    __assert_fail("hand_size_ * num_players_ <= cards_per_color_ * num_colors_",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jtwwang[P]hanabi/hanabi_lib/hanabi_game.cc"
                  ,0x3a,
                  "hanabi_learning_env::HanabiGame::HanabiGame(const std::unordered_map<std::string, std::string> &)"
                 );
  }
  __assert_fail("num_ranks_ > 0 && num_ranks_ <= kMaxNumRanks",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jtwwang[P]hanabi/hanabi_lib/hanabi_game.cc"
                ,0x25,
                "hanabi_learning_env::HanabiGame::HanabiGame(const std::unordered_map<std::string, std::string> &)"
               );
}

Assistant:

HanabiGame::HanabiGame(
    const std::unordered_map<std::string, std::string>& params) {
  params_ = params;
  num_players_ = ParameterValue<int>(params_, "players", kDefaultPlayers);
  REQUIRE(num_players_ >= MinPlayers() && num_players_ <= MaxPlayers());
  num_colors_ = ParameterValue<int>(params_, "colors", kMaxNumColors);
  REQUIRE(num_colors_ > 0 && num_colors_ <= kMaxNumColors);
  num_ranks_ = ParameterValue<int>(params_, "ranks", kMaxNumRanks);
  REQUIRE(num_ranks_ > 0 && num_ranks_ <= kMaxNumRanks);
  hand_size_ = ParameterValue<int>(params_, "hand_size", HandSizeFromRules());
  max_information_tokens_ = ParameterValue<int>(
      params_, "max_information_tokens", kInformationTokens);
  max_life_tokens_ =
      ParameterValue<int>(params_, "max_life_tokens", kLifeTokens);
  seed_ = ParameterValue<int>(params_, "seed", -1);
  random_start_player_ =
      ParameterValue<bool>(params_, "random_start_player", kDefaultRandomStart);
  observation_type_ = AgentObservationType(ParameterValue<int>(
      params_, "observation_type", AgentObservationType::kCardKnowledge));
  while (seed_ == -1) {
    seed_ = std::random_device()();
  }
  rng_.seed(seed_);

  // Work out number of cards per color, and check deck size is large enough.
  cards_per_color_ = 0;
  for (int rank = 0; rank < num_ranks_; ++rank) {
    cards_per_color_ += NumberCardInstances(0, rank);
  }
  REQUIRE(hand_size_ * num_players_ <= cards_per_color_ * num_colors_);

  // Build static list of moves.
  for (int uid = 0; uid < MaxMoves(); ++uid) {
    moves_.push_back(ConstructMove(uid));
  }
  for (int uid = 0; uid < MaxChanceOutcomes(); ++uid) {
    chance_outcomes_.push_back(ConstructChanceOutcome(uid));
  }
}